

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void prep_huffman(vorb *f)

{
  int iVar1;
  long in_RDI;
  int z;
  vorb *in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0x6e0) < 0x19) {
    if (*(int *)(in_RDI + 0x6e0) == 0) {
      *(undefined4 *)(in_RDI + 0x6dc) = 0;
    }
    do {
      if ((*(int *)(in_RDI + 0x6d4) != 0) && (*(char *)(in_RDI + 0x6cc) == '\0')) {
        return;
      }
      iVar1 = get8_packet_raw(in_stack_ffffffffffffffe8);
      if (iVar1 == -1) {
        return;
      }
      *(int *)(in_RDI + 0x6dc) =
           (iVar1 << ((byte)*(undefined4 *)(in_RDI + 0x6e0) & 0x1f)) + *(int *)(in_RDI + 0x6dc);
      *(int *)(in_RDI + 0x6e0) = *(int *)(in_RDI + 0x6e0) + 8;
    } while (*(int *)(in_RDI + 0x6e0) < 0x19);
  }
  return;
}

Assistant:

static __forceinline void prep_huffman(vorb *f)
{
   if (f->valid_bits <= 24) {
      if (f->valid_bits == 0) f->acc = 0;
      do {
         int z;
         if (f->last_seg && !f->bytes_in_seg) return;
         z = get8_packet_raw(f);
         if (z == EOP) return;
         f->acc += (unsigned) z << f->valid_bits;
         f->valid_bits += 8;
      } while (f->valid_bits <= 24);
   }
}